

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::DefaultPrintTo<Main>(long param_1,ostream *param_2)

{
  if (param_1 != 0) {
    std::ostream::_M_insert<void_const*>(param_2);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_2,"NULL",4);
  return;
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintPointer> /* dummy */,
                    T* p, ::std::ostream* os) {
  if (p == NULL) {
    *os << "NULL";
  } else {
    // T is not a function type.  We just call << to print p,
    // relying on ADL to pick up user-defined << for their pointer
    // types, if any.
    *os << p;
  }
}